

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::TestErrorHandler::handleClientProtocolError
          (TestErrorHandler *this,ProtocolError protocolError,Response *response)

{
  String *in_R9;
  StringPtr statusText;
  String message;
  Maybe<kj::HttpService::Response_&> local_58;
  Array<char> local_50;
  Array<char> local_38;
  
  encodeCEscape((String *)&local_38,(ArrayPtr<const_char>)protocolError.rawContent);
  str<char_const(&)[21],kj::StringPtr&,char_const(&)[16],kj::String>
            (&message,(kj *)"Saw protocol error: ",(char (*) [21])&protocolError.description,
             (StringPtr *)"; rawContent = ",(char (*) [16])&local_38,in_R9);
  Array<char>::~Array(&local_38);
  local_50.ptr = message.content.ptr;
  local_50.size_ = message.content.size_;
  local_50.disposer = message.content.disposer;
  message.content.ptr = (char *)0x0;
  message.content.size_ = 0;
  statusText.content.size_ = 0xc;
  statusText.content.ptr = "Bad Request";
  sendError(this,400,statusText,(String *)&local_50,&local_58);
  Array<char>::~Array(&local_50);
  Array<char>::~Array(&message.content);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> handleClientProtocolError(
      HttpHeaders::ProtocolError protocolError, kj::HttpService::Response& response) override {
    // In a real error handler, you should redact `protocolError.rawContent`.
    auto message = kj::str("Saw protocol error: ", protocolError.description, "; rawContent = ",
        encodeCEscape(protocolError.rawContent));
    return sendError(400, "Bad Request", kj::mv(message), response);
  }